

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytecodeparser.cpp
# Opt level: O2

void __thiscall
stackjit::ByteCodeParser::parseInstruction(ByteCodeParser *this,Function *currentFunction)

{
  OpCodes opCode;
  bool bVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  AttributeContainer *container;
  vector<stackjit::Loader::Instruction,_std::allocator<stackjit::Loader::Instruction>_> *pvVar6;
  size_type sVar7;
  mapped_type *pmVar8;
  size_t sVar9;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  reference pvVar10;
  long lVar11;
  runtime_error *prVar12;
  string *psVar13;
  float value_00;
  string localType;
  string currentToLower;
  string value;
  string classType;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  parameters;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_190;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_178;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_160;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_148;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  psVar13 = &localType;
  currentTokenToLower_abi_cxx11_(&currentToLower,this);
  bVar1 = std::operator==(&currentToLower,"@");
  if (bVar1) {
    container = Loader::Function::attributes_abi_cxx11_(currentFunction);
    parseAttribute(this,container);
    goto LAB_0012613d;
  }
  bVar1 = std::operator==(&currentToLower,"ldint");
  if (bVar1) {
    nextToken_abi_cxx11_(&localType,this);
    iVar4 = std::__cxx11::stoi(&localType,(size_t *)0x0,10);
    std::__cxx11::string::~string((string *)&localType);
    pvVar6 = Loader::Function::instructions(currentFunction);
    Loader::Instruction::makeWithInt((Instruction *)&localType,LOAD_INT,iVar4);
    std::vector<stackjit::Loader::Instruction,_std::allocator<stackjit::Loader::Instruction>_>::
    emplace_back<stackjit::Loader::Instruction>(pvVar6,(Instruction *)&localType);
  }
  else {
    bVar1 = std::operator==(&currentToLower,"ldfloat");
    if (bVar1) {
      nextToken_abi_cxx11_(&localType,this);
      value_00 = std::__cxx11::stof(&localType,(size_t *)0x0);
      std::__cxx11::string::~string((string *)&localType);
      pvVar6 = Loader::Function::instructions(currentFunction);
      Loader::Instruction::makeWithFloat(LOAD_FLOAT,value_00);
      std::vector<stackjit::Loader::Instruction,_std::allocator<stackjit::Loader::Instruction>_>::
      emplace_back<stackjit::Loader::Instruction>(pvVar6,(Instruction *)&localType);
    }
    else {
      bVar1 = std::operator==(&currentToLower,"ldchar");
      if (bVar1) {
        nextToken_abi_cxx11_(&localType,this);
        iVar4 = std::__cxx11::stoi(&localType,(size_t *)0x0,10);
        std::__cxx11::string::~string((string *)&localType);
        pvVar6 = Loader::Function::instructions(currentFunction);
        Loader::Instruction::makeWithChar((Instruction *)&localType,LOAD_CHAR,(char)iVar4);
        std::vector<stackjit::Loader::Instruction,_std::allocator<stackjit::Loader::Instruction>_>::
        emplace_back<stackjit::Loader::Instruction>(pvVar6,(Instruction *)&localType);
      }
      else {
        sVar7 = std::
                _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_stackjit::OpCodes>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_stackjit::OpCodes>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                ::count((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_stackjit::OpCodes>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_stackjit::OpCodes>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                         *)(anonymous_namespace)::noOperandsInstructions_abi_cxx11_,&currentToLower)
        ;
        if (sVar7 == 0) {
          sVar7 = std::
                  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_stackjit::OpCodes>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_stackjit::OpCodes>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  ::count((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_stackjit::OpCodes>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_stackjit::OpCodes>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                           *)(anonymous_namespace)::stringOperandInstructions_abi_cxx11_,
                          &currentToLower);
          if (sVar7 == 0) {
            bVar1 = std::operator==(&currentToLower,".locals");
            if (bVar1) {
              if (this->mLocalsSet == false) {
                nextToken_abi_cxx11_(&localType,this);
                iVar4 = std::__cxx11::stoi(&localType,(size_t *)0x0,10);
                std::__cxx11::string::~string((string *)&localType);
                if (iVar4 < 0) {
                  prVar12 = (runtime_error *)__cxa_allocate_exception(0x10);
                  std::runtime_error::runtime_error(prVar12,"The number of locals must be >= 0.");
                  __cxa_throw(prVar12,&std::runtime_error::typeinfo,
                              std::runtime_error::~runtime_error);
                }
                this->mLocalsSet = true;
                Loader::Function::setNumLocals(currentFunction,iVar4);
                goto LAB_0012613d;
              }
              prVar12 = (runtime_error *)__cxa_allocate_exception(0x10);
              std::runtime_error::runtime_error(prVar12,"The locals has already been set.");
              goto LAB_00126b38;
            }
            bVar1 = std::operator==(&currentToLower,".local");
            if (!bVar1) {
              bVar1 = std::operator==(&currentToLower,"ldloc");
              if (!bVar1) {
                bVar1 = std::operator==(&currentToLower,"stloc");
                if (!bVar1) {
                  bVar1 = std::operator==(&currentToLower,"call");
                  if (bVar1) {
LAB_001263dc:
                    bVar1 = std::operator==(&currentToLower,"callinst");
                    bVar2 = true;
                    if (!bVar1) {
                      bVar2 = std::operator==(&currentToLower,"callvirt");
                    }
                    bVar1 = std::operator==(&currentToLower,"callvirt");
                    nextToken_abi_cxx11_(&value,this);
                    std::__cxx11::string::string((string *)&classType,"",(allocator *)&localType);
                    if (bVar2 != false) {
                      lVar11 = std::__cxx11::string::find((char *)&value,0x12a1ad);
                      if (lVar11 == -1) {
                        prVar12 = (runtime_error *)__cxa_allocate_exception(0x10);
                        std::runtime_error::runtime_error
                                  (prVar12,"Expected \'::\' in called member function.");
                        __cxa_throw(prVar12,&std::runtime_error::typeinfo,
                                    std::runtime_error::~runtime_error);
                      }
                      std::__cxx11::string::substr((ulong)&localType,(ulong)&value);
                      std::__cxx11::string::operator=((string *)&classType,(string *)&localType);
                      std::__cxx11::string::~string((string *)&localType);
                      std::__cxx11::string::substr((ulong)&localType,(ulong)&value);
                      std::__cxx11::string::operator=((string *)&value,(string *)&localType);
                      std::__cxx11::string::~string((string *)&localType);
                    }
                    nextToken_abi_cxx11_(&localType,this);
                    bVar3 = std::operator!=(&localType,"(");
                    std::__cxx11::string::~string((string *)&localType);
                    if (bVar3) {
                      prVar12 = (runtime_error *)__cxa_allocate_exception(0x10);
                      std::runtime_error::runtime_error
                                (prVar12,"Expected \'(\' after called function.");
                      __cxa_throw(prVar12,&std::runtime_error::typeinfo,
                                  std::runtime_error::~runtime_error);
                    }
                    parameters.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                    parameters.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                    parameters.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                    readCallParameters(this,&parameters);
                    if (bVar2 == false) {
                      pvVar6 = Loader::Function::instructions(currentFunction);
                      std::__cxx11::string::string((string *)&local_f0,(string *)&value);
                      std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::vector(&local_178,&parameters);
                      Loader::Instruction::makeCall((Instruction *)&localType,&local_f0,&local_178);
                      std::
                      vector<stackjit::Loader::Instruction,_std::allocator<stackjit::Loader::Instruction>_>
                      ::emplace_back<stackjit::Loader::Instruction>
                                (pvVar6,(Instruction *)&localType);
                      Loader::Instruction::~Instruction((Instruction *)&localType);
                      std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::~vector(&local_178);
                      psVar13 = &local_f0;
                    }
                    else if (bVar1) {
                      pvVar6 = Loader::Function::instructions(currentFunction);
                      std::__cxx11::string::string((string *)&local_b0,(string *)&classType);
                      std::__cxx11::string::string((string *)&local_d0,(string *)&value);
                      std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::vector(&local_160,&parameters);
                      Loader::Instruction::makeCallVirtual
                                ((Instruction *)&localType,&local_b0,&local_d0,&local_160);
                      std::
                      vector<stackjit::Loader::Instruction,_std::allocator<stackjit::Loader::Instruction>_>
                      ::emplace_back<stackjit::Loader::Instruction>
                                (pvVar6,(Instruction *)&localType);
                      Loader::Instruction::~Instruction((Instruction *)&localType);
                      std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::~vector(&local_160);
                      std::__cxx11::string::~string((string *)&local_d0);
                      psVar13 = &local_b0;
                    }
                    else {
                      pvVar6 = Loader::Function::instructions(currentFunction);
                      std::__cxx11::string::string((string *)&local_70,(string *)&classType);
                      std::__cxx11::string::string((string *)&local_90,(string *)&value);
                      std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::vector(&local_148,&parameters);
                      Loader::Instruction::makeCallInstance
                                ((Instruction *)&localType,&local_70,&local_90,&local_148);
                      std::
                      vector<stackjit::Loader::Instruction,_std::allocator<stackjit::Loader::Instruction>_>
                      ::emplace_back<stackjit::Loader::Instruction>
                                (pvVar6,(Instruction *)&localType);
                      Loader::Instruction::~Instruction((Instruction *)&localType);
                      std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::~vector(&local_148);
                      std::__cxx11::string::~string((string *)&local_90);
                      psVar13 = &local_70;
                    }
                  }
                  else {
                    bVar1 = std::operator==(&currentToLower,"callinst");
                    if (bVar1) goto LAB_001263dc;
                    bVar1 = std::operator==(&currentToLower,"callvirt");
                    if (bVar1) goto LAB_001263dc;
                    bVar1 = std::operator==(&currentToLower,"ldarg");
                    if (bVar1) {
                      nextToken_abi_cxx11_(&localType,this);
                      iVar4 = std::__cxx11::stoi(&localType,(size_t *)0x0,10);
                      std::__cxx11::string::~string((string *)&localType);
                      pvVar6 = Loader::Function::instructions(currentFunction);
                      Loader::Instruction::makeWithInt((Instruction *)&localType,LOAD_ARG,iVar4);
                      std::
                      vector<stackjit::Loader::Instruction,_std::allocator<stackjit::Loader::Instruction>_>
                      ::emplace_back<stackjit::Loader::Instruction>
                                (pvVar6,(Instruction *)&localType);
                      goto LAB_00126135;
                    }
                    bVar1 = std::operator==(&currentToLower,"newobj");
                    if (!bVar1) {
                      bVar1 = std::operator==(&currentToLower,"br");
                      if (bVar1) {
                        nextToken_abi_cxx11_(&localType,this);
                        iVar4 = std::__cxx11::stoi(&localType,(size_t *)0x0,10);
                        std::__cxx11::string::~string((string *)&localType);
                        pvVar6 = Loader::Function::instructions(currentFunction);
                        Loader::Instruction::makeWithInt((Instruction *)&localType,BRANCH,iVar4);
                        std::
                        vector<stackjit::Loader::Instruction,_std::allocator<stackjit::Loader::Instruction>_>
                        ::emplace_back<stackjit::Loader::Instruction>
                                  (pvVar6,(Instruction *)&localType);
                      }
                      else {
                        sVar7 = std::
                                _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_stackjit::OpCodes>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_stackjit::OpCodes>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                                ::count((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_stackjit::OpCodes>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_stackjit::OpCodes>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                                         *)(anonymous_namespace)::branchInstructions_abi_cxx11_,
                                        &currentToLower);
                        if (sVar7 == 0) {
                          bVar1 = std::operator==(&currentToLower,"ldstr");
                          if (!bVar1) {
                            prVar12 = (runtime_error *)__cxa_allocate_exception(0x10);
                            currentToken_abi_cxx11_(&classType,this);
                            std::operator+(&value,"\'",&classType);
                            std::operator+(&localType,&value,"\' is not a valid instruction.");
                            std::runtime_error::runtime_error(prVar12,(string *)&localType);
                            __cxa_throw(prVar12,&std::runtime_error::typeinfo,
                                        std::runtime_error::~runtime_error);
                          }
                          pvVar6 = Loader::Function::instructions(currentFunction);
                          nextToken_abi_cxx11_(&local_130,this);
                          Loader::Instruction::makeWithStringConstant
                                    ((Instruction *)&localType,LOAD_STRING,&local_130);
                          std::
                          vector<stackjit::Loader::Instruction,_std::allocator<stackjit::Loader::Instruction>_>
                          ::emplace_back<stackjit::Loader::Instruction>
                                    (pvVar6,(Instruction *)&localType);
                          Loader::Instruction::~Instruction((Instruction *)&localType);
                          psVar13 = &local_130;
                          goto LAB_001261f3;
                        }
                        nextToken_abi_cxx11_(&localType,this);
                        iVar4 = std::__cxx11::stoi(&localType,(size_t *)0x0,10);
                        std::__cxx11::string::~string((string *)&localType);
                        pvVar6 = Loader::Function::instructions(currentFunction);
                        pmVar8 = std::__detail::
                                 _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_stackjit::OpCodes>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_stackjit::OpCodes>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                 ::at((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_stackjit::OpCodes>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_stackjit::OpCodes>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                       *)(anonymous_namespace)::branchInstructions_abi_cxx11_,
                                      &currentToLower);
                        Loader::Instruction::makeWithInt((Instruction *)&localType,*pmVar8,iVar4);
                        std::
                        vector<stackjit::Loader::Instruction,_std::allocator<stackjit::Loader::Instruction>_>
                        ::emplace_back<stackjit::Loader::Instruction>
                                  (pvVar6,(Instruction *)&localType);
                      }
                      goto LAB_00126135;
                    }
                    nextToken_abi_cxx11_(&value,this);
                    std::__cxx11::string::string((string *)&classType,"",(allocator *)&localType);
                    lVar11 = std::__cxx11::string::find((char *)&value,0x12a1ad);
                    if (lVar11 == -1) {
                      prVar12 = (runtime_error *)__cxa_allocate_exception(0x10);
                      std::runtime_error::runtime_error
                                (prVar12,
                                 "Expected \'::\' after the type in a new object instruction.");
LAB_00126c0a:
                      __cxa_throw(prVar12,&std::runtime_error::typeinfo,
                                  std::runtime_error::~runtime_error);
                    }
                    std::__cxx11::string::substr((ulong)&localType,(ulong)&value);
                    std::__cxx11::string::operator=((string *)&classType,(string *)&localType);
                    std::__cxx11::string::~string((string *)&localType);
                    std::__cxx11::string::substr((ulong)&localType,(ulong)&value);
                    std::__cxx11::string::operator=((string *)&value,(string *)&localType);
                    std::__cxx11::string::~string((string *)&localType);
                    bVar1 = std::operator!=(&value,".constructor");
                    if (bVar1) {
                      prVar12 = (runtime_error *)__cxa_allocate_exception(0x10);
                      std::runtime_error::runtime_error(prVar12,"Expected call to constructor.");
                      goto LAB_00126c0a;
                    }
                    nextToken_abi_cxx11_(&localType,this);
                    bVar1 = std::operator!=(&localType,"(");
                    std::__cxx11::string::~string((string *)&localType);
                    if (bVar1) {
                      prVar12 = (runtime_error *)__cxa_allocate_exception(0x10);
                      std::runtime_error::runtime_error
                                (prVar12,"Expected \'(\' after called function.");
                      goto LAB_00126c0a;
                    }
                    parameters.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                    parameters.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                    parameters.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                    readCallParameters(this,&parameters);
                    pvVar6 = Loader::Function::instructions(currentFunction);
                    std::__cxx11::string::string((string *)&local_110,(string *)&classType);
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::vector(&local_190,&parameters);
                    Loader::Instruction::makeNewObject
                              ((Instruction *)&localType,&local_110,&local_190);
                    std::
                    vector<stackjit::Loader::Instruction,_std::allocator<stackjit::Loader::Instruction>_>
                    ::emplace_back<stackjit::Loader::Instruction>(pvVar6,(Instruction *)&localType);
                    Loader::Instruction::~Instruction((Instruction *)&localType);
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::~vector(&local_190);
                    psVar13 = &local_110;
                  }
                  std::__cxx11::string::~string((string *)psVar13);
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::~vector(&parameters);
                  psVar13 = &classType;
                  goto LAB_001261e6;
                }
              }
              if (this->mLocalsSet == false) {
                prVar12 = (runtime_error *)__cxa_allocate_exception(0x10);
                std::runtime_error::runtime_error(prVar12,"The locals must be set.");
LAB_00126b38:
                __cxa_throw(prVar12,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error
                           );
              }
              nextToken_abi_cxx11_(&localType,this);
              iVar4 = std::__cxx11::stoi(&localType,(size_t *)0x0,10);
              std::__cxx11::string::~string((string *)&localType);
              bVar1 = std::operator==(&currentToLower,"ldloc");
              if (iVar4 < 0) {
LAB_00126acd:
                prVar12 = (runtime_error *)__cxa_allocate_exception(0x10);
                std::runtime_error::runtime_error(prVar12,"The local index is out of range.");
                __cxa_throw(prVar12,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error
                           );
              }
              sVar9 = Loader::Function::numLocals(currentFunction);
              if ((int)sVar9 <= iVar4) goto LAB_00126acd;
              pvVar6 = Loader::Function::instructions(currentFunction);
              Loader::Instruction::makeWithInt((Instruction *)&localType,STORE_LOCAL - bVar1,iVar4);
              std::
              vector<stackjit::Loader::Instruction,_std::allocator<stackjit::Loader::Instruction>_>
              ::emplace_back<stackjit::Loader::Instruction>(pvVar6,(Instruction *)&localType);
              goto LAB_00126135;
            }
            if (this->mLocalsSet != true) {
              prVar12 = (runtime_error *)__cxa_allocate_exception(0x10);
              std::runtime_error::runtime_error(prVar12,"The locals must been set.");
              goto LAB_00126b38;
            }
            nextToken_abi_cxx11_(&localType,this);
            uVar5 = std::__cxx11::stoi(&localType,(size_t *)0x0,10);
            std::__cxx11::string::~string((string *)&localType);
            nextToken_abi_cxx11_(&localType,this);
            if ((int)uVar5 < 0) {
LAB_00126a98:
              prVar12 = (runtime_error *)__cxa_allocate_exception(0x10);
              std::runtime_error::runtime_error(prVar12,"Invalid local index.");
              __cxa_throw(prVar12,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
            }
            sVar9 = Loader::Function::numLocals(currentFunction);
            if ((int)sVar9 <= (int)uVar5) goto LAB_00126a98;
            this_00 = Loader::Function::localTypes_abi_cxx11_(currentFunction);
            pvVar10 = std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::at(this_00,(ulong)uVar5);
            std::__cxx11::string::_M_assign((string *)pvVar10);
          }
          else {
            nextToken_abi_cxx11_(&value,this);
            pvVar6 = Loader::Function::instructions(currentFunction);
            pmVar8 = std::__detail::
                     _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_stackjit::OpCodes>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_stackjit::OpCodes>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                     ::at((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_stackjit::OpCodes>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_stackjit::OpCodes>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)(anonymous_namespace)::stringOperandInstructions_abi_cxx11_,
                          &currentToLower);
            opCode = *pmVar8;
            std::__cxx11::string::string((string *)&local_50,(string *)&value);
            Loader::Instruction::makeWithString((Instruction *)&localType,opCode,&local_50);
            std::
            vector<stackjit::Loader::Instruction,_std::allocator<stackjit::Loader::Instruction>_>::
            emplace_back<stackjit::Loader::Instruction>(pvVar6,(Instruction *)&localType);
            Loader::Instruction::~Instruction((Instruction *)&localType);
            psVar13 = &local_50;
LAB_001261e6:
            std::__cxx11::string::~string((string *)psVar13);
            psVar13 = &value;
          }
LAB_001261f3:
          std::__cxx11::string::~string((string *)psVar13);
          goto LAB_0012613d;
        }
        pvVar6 = Loader::Function::instructions(currentFunction);
        pmVar8 = std::__detail::
                 _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_stackjit::OpCodes>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_stackjit::OpCodes>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                 ::at((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_stackjit::OpCodes>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_stackjit::OpCodes>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                       *)(anonymous_namespace)::noOperandsInstructions_abi_cxx11_,&currentToLower);
        Loader::Instruction::make(*pmVar8);
        std::vector<stackjit::Loader::Instruction,_std::allocator<stackjit::Loader::Instruction>_>::
        emplace_back<stackjit::Loader::Instruction>(pvVar6,(Instruction *)&localType);
      }
    }
  }
LAB_00126135:
  Loader::Instruction::~Instruction((Instruction *)&localType);
LAB_0012613d:
  std::__cxx11::string::~string((string *)&currentToLower);
  return;
}

Assistant:

void ByteCodeParser::parseInstruction(Loader::Function& currentFunction) {
		using namespace Loader;
		auto currentToLower = currentTokenToLower();

		if (currentToLower == "@") {
			parseAttribute(currentFunction.attributes());
			return;
		}

		if (currentToLower == "ldint") {
			int value = stoi(nextToken());
			currentFunction.instructions().push_back(Instruction::makeWithInt(OpCodes::LOAD_INT, value));
			return;
		}

		if (currentToLower == "ldfloat") {
			float value = stof(nextToken());
			currentFunction.instructions().push_back(Instruction::makeWithFloat(OpCodes::LOAD_FLOAT, value));
			return;
		}

		if (currentToLower == "ldchar") {
			char value = (char)stoi(nextToken());
			currentFunction.instructions().push_back(Instruction::makeWithChar(OpCodes::LOAD_CHAR, value));
			return;
		}

		if (noOperandsInstructions.count(currentToLower) > 0) {
			currentFunction.instructions().push_back(Instruction::make(noOperandsInstructions.at(currentToLower)));
			return;
		}

		if (stringOperandInstructions.count(currentToLower) > 0) {
			std::string value = nextToken();
			currentFunction.instructions().push_back(Instruction::makeWithString(stringOperandInstructions.at(currentToLower), value));
			return;
		}

		if (currentToLower == ".locals") {
			if (!mLocalsSet) {
				int localsCount = stoi(nextToken());

				if (localsCount >= 0) {
					mLocalsSet = true;
					currentFunction.setNumLocals(localsCount);
				} else {
					throw std::runtime_error("The number of locals must be >= 0.");
				}

				return;
			} else {
				throw std::runtime_error("The locals has already been set.");
			}
		}

		if (currentToLower == ".local") {
			if (mLocalsSet) {
				int localIndex = stoi(nextToken());
				auto localType = nextToken();

				if (localIndex >= 0 && localIndex < (int)currentFunction.numLocals()) {
					currentFunction.localTypes().at((std::size_t)localIndex) = localType;
				} else {
					throw std::runtime_error("Invalid local index.");
				}

				return;
			} else {
				throw std::runtime_error("The locals must been set.");
			}
		}

		if (currentToLower == "ldloc" || currentToLower == "stloc") {
			if (!mLocalsSet) {
				throw std::runtime_error("The locals must be set.");
			}

			int local = stoi(nextToken());
			auto opCode = currentToLower == "ldloc" ? OpCodes::LOAD_LOCAL : OpCodes::STORE_LOCAL;

			if (local >= 0 && local < (int)currentFunction.numLocals()) {
				currentFunction.instructions().push_back(Instruction::makeWithInt(opCode, local));
				return;
			} else {
				throw std::runtime_error("The local index is out of range.");
			}
		}

		if (currentToLower == "call" || currentToLower == "callinst" || currentToLower == "callvirt") {
			bool isInstance = currentToLower == "callinst" || currentToLower == "callvirt";
			bool isVirtual = currentToLower == "callvirt";

			auto funcName = nextToken();
			std::string classType = "";

			if (isInstance) {
				auto classNamePosition = funcName.find("::");
				if (classNamePosition != std::string::npos) {
					classType = funcName.substr(0, classNamePosition);
				} else {
					throw std::runtime_error("Expected '::' in called member function.");
				}

				funcName = funcName.substr(classNamePosition + 2);
			}

			if (nextToken() != "(") {
				throw std::runtime_error("Expected '(' after called function.");
			}

			std::vector<std::string> parameters;
			readCallParameters(parameters);

			if (isInstance) {
				if (!isVirtual) {
					currentFunction.instructions().push_back(Instruction::makeCallInstance(classType, funcName, parameters));
				} else {
					currentFunction.instructions().push_back(Instruction::makeCallVirtual(classType, funcName, parameters));
				}
			} else {
				currentFunction.instructions().push_back(Instruction::makeCall(funcName, parameters));
			}

			return;
		}

		if (currentToLower == "ldarg") {
			int argumentNum = stoi(nextToken());
			currentFunction.instructions().push_back(Instruction::makeWithInt(OpCodes::LOAD_ARG, argumentNum));
			return;
		}

		if (currentToLower == "newobj") {
			auto funcName = nextToken();
			std::string classType = "";

			auto classNamePosition = funcName.find("::");
			if (classNamePosition != std::string::npos) {
				classType = funcName.substr(0, classNamePosition);
			} else {
				throw std::runtime_error("Expected '::' after the type in a new object instruction.");
			}

			funcName = funcName.substr(classNamePosition + 2);

			if (funcName != ".constructor") {
				throw std::runtime_error("Expected call to constructor.");
			}

			if (nextToken() != "(") {
				throw std::runtime_error("Expected '(' after called function.");
			}

			std::vector<std::string> parameters;
			readCallParameters(parameters);
			currentFunction.instructions().push_back(Instruction::makeNewObject(classType, parameters));
			return;
		}

		if (currentToLower == "br") {
			int target = stoi(nextToken());
			currentFunction.instructions().push_back(Instruction::makeWithInt(OpCodes::BRANCH, target));
			return;
		}

		if (branchInstructions.count(currentToLower) > 0) {
			int target = stoi(nextToken());
			currentFunction.instructions().push_back(Instruction::makeWithInt(branchInstructions.at(currentToLower), target));
			return;
		}

		if (currentToLower == "ldstr") {
			currentFunction.instructions().push_back(Instruction::makeWithStringConstant(OpCodes::LOAD_STRING, nextToken()));
			return;
		}

		throw std::runtime_error("'" + currentToken() + "' is not a valid instruction.");
	}